

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jctrans.c
# Opt level: O0

void jpeg_copy_critical_parameters(j_decompress_ptr srcinfo,j_compress_ptr dstinfo)

{
  long *plVar1;
  JQUANT_TBL *pJVar2;
  long *in_RSI;
  long in_RDI;
  int coefi;
  int ci;
  int tblno;
  JQUANT_TBL *slot_quant;
  JQUANT_TBL *c_quant;
  jpeg_component_info *outcomp;
  jpeg_component_info *incomp;
  JQUANT_TBL **qtblptr;
  int local_44;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar3;
  int iVar4;
  undefined8 in_stack_ffffffffffffffc8;
  J_COLOR_SPACE colorspace;
  long lVar5;
  j_compress_ptr in_stack_ffffffffffffffd0;
  long lVar6;
  undefined4 *local_28;
  undefined4 *local_20;
  
  colorspace = (J_COLOR_SPACE)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if (*(int *)((long)in_RSI + 0x24) != 100) {
    *(undefined4 *)(*in_RSI + 0x28) = 0x14;
    *(undefined4 *)(*in_RSI + 0x2c) = *(undefined4 *)((long)in_RSI + 0x24);
    (**(code **)*in_RSI)(in_RSI);
  }
  *(undefined4 *)(in_RSI + 6) = *(undefined4 *)(in_RDI + 0x30);
  *(undefined4 *)((long)in_RSI + 0x34) = *(undefined4 *)(in_RDI + 0x34);
  *(undefined4 *)(in_RSI + 7) = *(undefined4 *)(in_RDI + 0x38);
  *(undefined4 *)((long)in_RSI + 0x3c) = *(undefined4 *)(in_RDI + 0x3c);
  jpeg_set_defaults((j_compress_ptr)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  jpeg_set_colorspace(in_stack_ffffffffffffffd0,colorspace);
  *(undefined4 *)(in_RSI + 9) = *(undefined4 *)(in_RDI + 0x128);
  *(undefined4 *)((long)in_RSI + 0x10c) = *(undefined4 *)(in_RDI + 0x188);
  for (iVar3 = 0; iVar3 < 4; iVar3 = iVar3 + 1) {
    if (*(long *)(in_RDI + 200 + (long)iVar3 * 8) != 0) {
      plVar1 = in_RSI + (long)iVar3 + 0xc;
      if (*plVar1 == 0) {
        pJVar2 = jpeg_alloc_quant_table((j_common_ptr)CONCAT44(iVar3,in_stack_ffffffffffffffc0));
        *plVar1 = (long)pJVar2;
      }
      memcpy((void *)*plVar1,*(void **)(in_RDI + 200 + (long)iVar3 * 8),0x80);
      *(undefined4 *)(*plVar1 + 0x80) = 0;
    }
  }
  *(undefined4 *)((long)in_RSI + 0x4c) = *(undefined4 *)(in_RDI + 0x38);
  if ((*(int *)((long)in_RSI + 0x4c) < 1) || (10 < *(int *)((long)in_RSI + 0x4c))) {
    *(undefined4 *)(*in_RSI + 0x28) = 0x1a;
    *(undefined4 *)(*in_RSI + 0x2c) = *(undefined4 *)((long)in_RSI + 0x4c);
    *(undefined4 *)(*in_RSI + 0x30) = 10;
    (**(code **)*in_RSI)(in_RSI);
  }
  local_20 = *(undefined4 **)(in_RDI + 0x130);
  local_28 = (undefined4 *)in_RSI[0xb];
  for (iVar3 = 0; iVar3 < *(int *)((long)in_RSI + 0x4c); iVar3 = iVar3 + 1) {
    *local_28 = *local_20;
    local_28[2] = local_20[2];
    local_28[3] = local_20[3];
    local_28[4] = local_20[4];
    iVar4 = local_28[4];
    if (((iVar4 < 0) || (3 < iVar4)) || (*(long *)(in_RDI + 200 + (long)iVar4 * 8) == 0)) {
      *(undefined4 *)(*in_RSI + 0x28) = 0x34;
      *(int *)(*in_RSI + 0x2c) = iVar4;
      (**(code **)*in_RSI)(in_RSI);
    }
    lVar5 = *(long *)(in_RDI + 200 + (long)iVar4 * 8);
    lVar6 = *(long *)(local_20 + 0x14);
    if (lVar6 != 0) {
      for (local_44 = 0; local_44 < 0x40; local_44 = local_44 + 1) {
        if (*(short *)(lVar6 + (long)local_44 * 2) != *(short *)(lVar5 + (long)local_44 * 2)) {
          *(undefined4 *)(*in_RSI + 0x28) = 0x2c;
          *(int *)(*in_RSI + 0x2c) = iVar4;
          (**(code **)*in_RSI)(in_RSI);
        }
      }
    }
    local_20 = local_20 + 0x18;
    local_28 = local_28 + 0x18;
  }
  if (*(int *)(in_RDI + 0x174) != 0) {
    if (*(char *)(in_RDI + 0x178) == '\x01') {
      *(undefined1 *)((long)in_RSI + 0x124) = *(undefined1 *)(in_RDI + 0x178);
      *(undefined1 *)((long)in_RSI + 0x125) = *(undefined1 *)(in_RDI + 0x179);
    }
    *(undefined1 *)((long)in_RSI + 0x126) = *(undefined1 *)(in_RDI + 0x17a);
    *(undefined2 *)(in_RSI + 0x25) = *(undefined2 *)(in_RDI + 0x17c);
    *(undefined2 *)((long)in_RSI + 0x12a) = *(undefined2 *)(in_RDI + 0x17e);
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_copy_critical_parameters(j_decompress_ptr srcinfo, j_compress_ptr dstinfo)
{
  JQUANT_TBL **qtblptr;
  jpeg_component_info *incomp, *outcomp;
  JQUANT_TBL *c_quant, *slot_quant;
  int tblno, ci, coefi;

  /* Safety check to ensure start_compress not called yet. */
  if (dstinfo->global_state != CSTATE_START)
    ERREXIT1(dstinfo, JERR_BAD_STATE, dstinfo->global_state);
  /* Copy fundamental image dimensions */
  dstinfo->image_width = srcinfo->image_width;
  dstinfo->image_height = srcinfo->image_height;
  dstinfo->input_components = srcinfo->num_components;
  dstinfo->in_color_space = srcinfo->jpeg_color_space;
#if JPEG_LIB_VERSION >= 70
  dstinfo->jpeg_width = srcinfo->output_width;
  dstinfo->jpeg_height = srcinfo->output_height;
  dstinfo->min_DCT_h_scaled_size = srcinfo->min_DCT_h_scaled_size;
  dstinfo->min_DCT_v_scaled_size = srcinfo->min_DCT_v_scaled_size;
#endif
  /* Initialize all parameters to default values */
  jpeg_set_defaults(dstinfo);
  /* jpeg_set_defaults may choose wrong colorspace, eg YCbCr if input is RGB.
   * Fix it to get the right header markers for the image colorspace.
   */
  jpeg_set_colorspace(dstinfo, srcinfo->jpeg_color_space);
  dstinfo->data_precision = srcinfo->data_precision;
  dstinfo->CCIR601_sampling = srcinfo->CCIR601_sampling;
  /* Copy the source's quantization tables. */
  for (tblno = 0; tblno < NUM_QUANT_TBLS; tblno++) {
    if (srcinfo->quant_tbl_ptrs[tblno] != NULL) {
      qtblptr = &dstinfo->quant_tbl_ptrs[tblno];
      if (*qtblptr == NULL)
        *qtblptr = jpeg_alloc_quant_table((j_common_ptr)dstinfo);
      MEMCOPY((*qtblptr)->quantval, srcinfo->quant_tbl_ptrs[tblno]->quantval,
              sizeof((*qtblptr)->quantval));
      (*qtblptr)->sent_table = FALSE;
    }
  }
  /* Copy the source's per-component info.
   * Note we assume jpeg_set_defaults has allocated the dest comp_info array.
   */
  dstinfo->num_components = srcinfo->num_components;
  if (dstinfo->num_components < 1 || dstinfo->num_components > MAX_COMPONENTS)
    ERREXIT2(dstinfo, JERR_COMPONENT_COUNT, dstinfo->num_components,
             MAX_COMPONENTS);
  for (ci = 0, incomp = srcinfo->comp_info, outcomp = dstinfo->comp_info;
       ci < dstinfo->num_components; ci++, incomp++, outcomp++) {
    outcomp->component_id = incomp->component_id;
    outcomp->h_samp_factor = incomp->h_samp_factor;
    outcomp->v_samp_factor = incomp->v_samp_factor;
    outcomp->quant_tbl_no = incomp->quant_tbl_no;
    /* Make sure saved quantization table for component matches the qtable
     * slot.  If not, the input file re-used this qtable slot.
     * IJG encoder currently cannot duplicate this.
     */
    tblno = outcomp->quant_tbl_no;
    if (tblno < 0 || tblno >= NUM_QUANT_TBLS ||
        srcinfo->quant_tbl_ptrs[tblno] == NULL)
      ERREXIT1(dstinfo, JERR_NO_QUANT_TABLE, tblno);
    slot_quant = srcinfo->quant_tbl_ptrs[tblno];
    c_quant = incomp->quant_table;
    if (c_quant != NULL) {
      for (coefi = 0; coefi < DCTSIZE2; coefi++) {
        if (c_quant->quantval[coefi] != slot_quant->quantval[coefi])
          ERREXIT1(dstinfo, JERR_MISMATCHED_QUANT_TABLE, tblno);
      }
    }
    /* Note: we do not copy the source's Huffman table assignments;
     * instead we rely on jpeg_set_colorspace to have made a suitable choice.
     */
  }
  /* Also copy JFIF version and resolution information, if available.
   * Strictly speaking this isn't "critical" info, but it's nearly
   * always appropriate to copy it if available.  In particular,
   * if the application chooses to copy JFIF 1.02 extension markers from
   * the source file, we need to copy the version to make sure we don't
   * emit a file that has 1.02 extensions but a claimed version of 1.01.
   * We will *not*, however, copy version info from mislabeled "2.01" files.
   */
  if (srcinfo->saw_JFIF_marker) {
    if (srcinfo->JFIF_major_version == 1) {
      dstinfo->JFIF_major_version = srcinfo->JFIF_major_version;
      dstinfo->JFIF_minor_version = srcinfo->JFIF_minor_version;
    }
    dstinfo->density_unit = srcinfo->density_unit;
    dstinfo->X_density = srcinfo->X_density;
    dstinfo->Y_density = srcinfo->Y_density;
  }
}